

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void hadamard_16x16_sse2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff,int is_final)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  int in_ECX;
  tran_low_t *in_RDX;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i coeff3;
  __m128i coeff2;
  __m128i coeff1;
  __m128i coeff0;
  int16_t *src_ptr;
  int idx;
  int16_t *coeff16;
  int16_t *t_coeff;
  int16_t temp_coeff [256];
  undefined8 local_520;
  undefined8 uStackY_518;
  undefined8 local_510;
  undefined8 uStackY_508;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  int iVar25;
  undefined8 *src_stride_00;
  int16_t *in_stack_fffffffffffffb80;
  short local_250;
  short sStack_24e;
  short sStack_24c;
  short sStack_24a;
  short sStack_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short local_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short sStack_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short local_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short sStack_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short local_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short sStack_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short local_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short sStack_1e8;
  short sStack_1e6;
  short sStack_1e4;
  short sStack_1e2;
  short local_1e0;
  short sStack_1de;
  short sStack_1dc;
  short sStack_1da;
  short sStack_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  
  src_stride_00 = (undefined8 *)&stack0xfffffffffffffb80;
  for (iVar25 = 0; iVar25 < 4; iVar25 = iVar25 + 1) {
    hadamard_8x8_sse2(in_stack_fffffffffffffb80,(ptrdiff_t)src_stride_00,in_RDX,iVar25);
  }
  for (iVar25 = 0; iVar25 < 0x40; iVar25 = iVar25 + 8) {
    uVar1 = *src_stride_00;
    uVar2 = src_stride_00[1];
    uVar3 = src_stride_00[0x10];
    uVar4 = src_stride_00[0x11];
    uVar5 = src_stride_00[0x20];
    uVar6 = src_stride_00[0x21];
    uVar7 = src_stride_00[0x30];
    uVar8 = src_stride_00[0x31];
    local_1e0 = (short)uVar1;
    sStack_1de = (short)((ulong)uVar1 >> 0x10);
    sStack_1dc = (short)((ulong)uVar1 >> 0x20);
    sStack_1da = (short)((ulong)uVar1 >> 0x30);
    sStack_1d8 = (short)uVar2;
    sStack_1d6 = (short)((ulong)uVar2 >> 0x10);
    sStack_1d4 = (short)((ulong)uVar2 >> 0x20);
    sStack_1d2 = (short)((ulong)uVar2 >> 0x30);
    local_1f0 = (short)uVar3;
    sStack_1ee = (short)((ulong)uVar3 >> 0x10);
    sStack_1ec = (short)((ulong)uVar3 >> 0x20);
    sStack_1ea = (short)((ulong)uVar3 >> 0x30);
    sStack_1e8 = (short)uVar4;
    sStack_1e6 = (short)((ulong)uVar4 >> 0x10);
    sStack_1e4 = (short)((ulong)uVar4 >> 0x20);
    sStack_1e2 = (short)((ulong)uVar4 >> 0x30);
    local_200 = (short)uVar5;
    sStack_1fe = (short)((ulong)uVar5 >> 0x10);
    sStack_1fc = (short)((ulong)uVar5 >> 0x20);
    sStack_1fa = (short)((ulong)uVar5 >> 0x30);
    sStack_1f8 = (short)uVar6;
    sStack_1f6 = (short)((ulong)uVar6 >> 0x10);
    sStack_1f4 = (short)((ulong)uVar6 >> 0x20);
    sStack_1f2 = (short)((ulong)uVar6 >> 0x30);
    local_210 = (short)uVar7;
    sStack_20e = (short)((ulong)uVar7 >> 0x10);
    sStack_20c = (short)((ulong)uVar7 >> 0x20);
    sStack_20a = (short)((ulong)uVar7 >> 0x30);
    sStack_208 = (short)uVar8;
    sStack_206 = (short)((ulong)uVar8 >> 0x10);
    sStack_204 = (short)((ulong)uVar8 >> 0x20);
    sStack_202 = (short)((ulong)uVar8 >> 0x30);
    local_510._0_4_ = CONCAT22(sStack_1fe + sStack_20e,local_200 + local_210);
    local_510._0_6_ = CONCAT24(sStack_1fc + sStack_20c,(undefined4)local_510);
    local_510 = CONCAT26(sStack_1fa + sStack_20a,(undefined6)local_510);
    uStackY_508._0_2_ = sStack_1f8 + sStack_208;
    uStackY_508._2_2_ = sStack_1f6 + sStack_206;
    uStackY_508._4_2_ = sStack_1f4 + sStack_204;
    uStackY_508._6_2_ = sStack_1f2 + sStack_202;
    local_520._0_4_ = CONCAT22(sStack_1fe - sStack_20e,local_200 - local_210);
    local_520._0_6_ = CONCAT24(sStack_1fc - sStack_20c,(undefined4)local_520);
    local_520 = CONCAT26(sStack_1fa - sStack_20a,(undefined6)local_520);
    uStackY_518._0_2_ = sStack_1f8 - sStack_208;
    uStackY_518._2_2_ = sStack_1f6 - sStack_206;
    uStackY_518._4_2_ = sStack_1f4 - sStack_204;
    uStackY_518._6_2_ = sStack_1f2 - sStack_202;
    auVar9._2_2_ = sStack_1de + sStack_1ee;
    auVar9._0_2_ = local_1e0 + local_1f0;
    auVar9._4_2_ = sStack_1dc + sStack_1ec;
    auVar9._6_2_ = sStack_1da + sStack_1ea;
    auVar9._10_2_ = sStack_1d6 + sStack_1e6;
    auVar9._8_2_ = sStack_1d8 + sStack_1e8;
    auVar9._12_2_ = sStack_1d4 + sStack_1e4;
    auVar9._14_2_ = sStack_1d2 + sStack_1e2;
    auVar9 = psraw(auVar9,ZEXT416(1));
    sVar21 = auVar9._0_2_;
    sVar22 = auVar9._2_2_;
    sVar23 = auVar9._4_2_;
    sVar24 = auVar9._6_2_;
    auVar10._2_2_ = sStack_1de - sStack_1ee;
    auVar10._0_2_ = local_1e0 - local_1f0;
    auVar10._4_2_ = sStack_1dc - sStack_1ec;
    auVar10._6_2_ = sStack_1da - sStack_1ea;
    auVar10._10_2_ = sStack_1d6 - sStack_1e6;
    auVar10._8_2_ = sStack_1d8 - sStack_1e8;
    auVar10._12_2_ = sStack_1d4 - sStack_1e4;
    auVar10._14_2_ = sStack_1d2 - sStack_1e2;
    auVar10 = psraw(auVar10,ZEXT416(1));
    sVar13 = auVar10._0_2_;
    sVar14 = auVar10._2_2_;
    sVar15 = auVar10._4_2_;
    sVar16 = auVar10._6_2_;
    sVar17 = auVar10._8_2_;
    sVar18 = auVar10._10_2_;
    sVar19 = auVar10._12_2_;
    sVar20 = auVar10._14_2_;
    auVar11._8_8_ = uStackY_508;
    auVar11._0_8_ = local_510;
    auVar11 = psraw(auVar11,ZEXT416(1));
    auVar12._8_8_ = uStackY_518;
    auVar12._0_8_ = local_520;
    auVar12 = psraw(auVar12,ZEXT416(1));
    sStack_218 = auVar9._8_2_;
    sStack_216 = auVar9._10_2_;
    sStack_214 = auVar9._12_2_;
    sStack_212 = auVar9._14_2_;
    local_230 = auVar11._0_2_;
    sStack_22e = auVar11._2_2_;
    sStack_22c = auVar11._4_2_;
    sStack_22a = auVar11._6_2_;
    sStack_228 = auVar11._8_2_;
    sStack_226 = auVar11._10_2_;
    sStack_224 = auVar11._12_2_;
    sStack_222 = auVar11._14_2_;
    local_4b0 = CONCAT26(sVar24 + sStack_22a,
                         CONCAT24(sVar23 + sStack_22c,
                                  CONCAT22(sVar22 + sStack_22e,sVar21 + local_230)));
    uStack_4a8 = CONCAT26(sStack_212 + sStack_222,
                          CONCAT24(sStack_214 + sStack_224,
                                   CONCAT22(sStack_216 + sStack_226,sStack_218 + sStack_228)));
    local_250 = auVar12._0_2_;
    sStack_24e = auVar12._2_2_;
    sStack_24c = auVar12._4_2_;
    sStack_24a = auVar12._6_2_;
    sStack_248 = auVar12._8_2_;
    sStack_246 = auVar12._10_2_;
    sStack_244 = auVar12._12_2_;
    sStack_242 = auVar12._14_2_;
    local_4c0 = CONCAT26(sVar16 + sStack_24a,
                         CONCAT24(sVar15 + sStack_24c,
                                  CONCAT22(sVar14 + sStack_24e,sVar13 + local_250)));
    uStack_4b8 = CONCAT26(sVar20 + sStack_242,
                          CONCAT24(sVar19 + sStack_244,
                                   CONCAT22(sVar18 + sStack_246,sVar17 + sStack_248)));
    local_4d0 = CONCAT26(sVar24 - sStack_22a,
                         CONCAT24(sVar23 - sStack_22c,
                                  CONCAT22(sVar22 - sStack_22e,sVar21 - local_230)));
    uStack_4c8 = CONCAT26(sStack_212 - sStack_222,
                          CONCAT24(sStack_214 - sStack_224,
                                   CONCAT22(sStack_216 - sStack_226,sStack_218 - sStack_228)));
    local_4e0 = CONCAT26(sVar16 - sStack_24a,
                         CONCAT24(sVar15 - sStack_24c,
                                  CONCAT22(sVar14 - sStack_24e,sVar13 - local_250)));
    uStack_4d8 = CONCAT26(sVar20 - sStack_242,
                          CONCAT24(sVar19 - sStack_244,
                                   CONCAT22(sVar18 - sStack_246,sVar17 - sStack_248)));
    if (in_ECX == 0) {
      *(undefined8 *)in_RDX = local_4b0;
      *(undefined8 *)(in_RDX + 2) = uStack_4a8;
      *(undefined8 *)(in_RDX + 0x20) = local_4c0;
      *(undefined8 *)(in_RDX + 0x22) = uStack_4b8;
      *(undefined8 *)(in_RDX + 0x40) = local_4d0;
      *(undefined8 *)(in_RDX + 0x42) = uStack_4c8;
      *(undefined8 *)(in_RDX + 0x60) = local_4e0;
      *(undefined8 *)(in_RDX + 0x62) = uStack_4d8;
      in_RDX = in_RDX + 4;
    }
    else {
      a[1]._0_2_ = sVar21;
      a[0] = auVar10._8_8_;
      a[1]._2_2_ = sVar22;
      a[1]._4_2_ = sVar23;
      a[1]._6_2_ = sVar24;
      store_tran_low_offset_4(a,auVar10._0_8_);
      a_00[0]._2_2_ = sVar18;
      a_00[0]._0_2_ = sVar17;
      a_00[0]._4_2_ = sVar19;
      a_00[0]._6_2_ = sVar20;
      a_00[1]._0_2_ = sVar21;
      a_00[1]._2_2_ = sVar22;
      a_00[1]._4_2_ = sVar23;
      a_00[1]._6_2_ = sVar24;
      store_tran_low_offset_4
                (a_00,(tran_low_t *)CONCAT26(sVar16,CONCAT24(sVar15,CONCAT22(sVar14,sVar13))));
      a_01[0]._2_2_ = sVar18;
      a_01[0]._0_2_ = sVar17;
      a_01[0]._4_2_ = sVar19;
      a_01[0]._6_2_ = sVar20;
      a_01[1]._0_2_ = sVar21;
      a_01[1]._2_2_ = sVar22;
      a_01[1]._4_2_ = sVar23;
      a_01[1]._6_2_ = sVar24;
      store_tran_low_offset_4
                (a_01,(tran_low_t *)CONCAT26(sVar16,CONCAT24(sVar15,CONCAT22(sVar14,sVar13))));
      a_02[0]._2_2_ = sVar18;
      a_02[0]._0_2_ = sVar17;
      a_02[0]._4_2_ = sVar19;
      a_02[0]._6_2_ = sVar20;
      a_02[1]._0_2_ = sVar21;
      a_02[1]._2_2_ = sVar22;
      a_02[1]._4_2_ = sVar23;
      a_02[1]._6_2_ = sVar24;
      store_tran_low_offset_4
                (a_02,(tran_low_t *)CONCAT26(sVar16,CONCAT24(sVar15,CONCAT22(sVar14,sVar13))));
    }
    src_stride_00 = src_stride_00 + 2;
  }
  return;
}

Assistant:

static inline void hadamard_16x16_sse2(const int16_t *src_diff,
                                       ptrdiff_t src_stride, tran_low_t *coeff,
                                       int is_final) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[16 * 16]);
  int16_t *t_coeff = temp_coeff;
  int16_t *coeff16 = (int16_t *)coeff;
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    hadamard_8x8_sse2(src_ptr, src_stride, (tran_low_t *)(t_coeff + idx * 64),
                      0);
  }

  for (idx = 0; idx < 64; idx += 8) {
    __m128i coeff0 = _mm_load_si128((const __m128i *)t_coeff);
    __m128i coeff1 = _mm_load_si128((const __m128i *)(t_coeff + 64));
    __m128i coeff2 = _mm_load_si128((const __m128i *)(t_coeff + 128));
    __m128i coeff3 = _mm_load_si128((const __m128i *)(t_coeff + 192));

    __m128i b0 = _mm_add_epi16(coeff0, coeff1);
    __m128i b1 = _mm_sub_epi16(coeff0, coeff1);
    __m128i b2 = _mm_add_epi16(coeff2, coeff3);
    __m128i b3 = _mm_sub_epi16(coeff2, coeff3);

    b0 = _mm_srai_epi16(b0, 1);
    b1 = _mm_srai_epi16(b1, 1);
    b2 = _mm_srai_epi16(b2, 1);
    b3 = _mm_srai_epi16(b3, 1);

    coeff0 = _mm_add_epi16(b0, b2);
    coeff1 = _mm_add_epi16(b1, b3);
    coeff2 = _mm_sub_epi16(b0, b2);
    coeff3 = _mm_sub_epi16(b1, b3);

    if (is_final) {
      store_tran_low_offset_4(coeff0, coeff);
      store_tran_low_offset_4(coeff1, coeff + 64);
      store_tran_low_offset_4(coeff2, coeff + 128);
      store_tran_low_offset_4(coeff3, coeff + 192);
      coeff += 4;
    } else {
      _mm_store_si128((__m128i *)coeff16, coeff0);
      _mm_store_si128((__m128i *)(coeff16 + 64), coeff1);
      _mm_store_si128((__m128i *)(coeff16 + 128), coeff2);
      _mm_store_si128((__m128i *)(coeff16 + 192), coeff3);
      coeff16 += 8;
    }

    t_coeff += 8;
    // Increment the pointer additionally by 0 and 8 in alternate
    // iterations(instead of 8) to ensure the coherency with the implementation
    // of store_tran_low_offset_4()
    coeff += (((idx >> 3) & 1) << 3);
  }
}